

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QDockWidget * __thiscall QMainWindowTabBar::dockAt(QMainWindowTabBar *this,int index)

{
  int iVar1;
  QDockAreaLayoutInfo *pQVar2;
  const_reference pQVar3;
  int in_ESI;
  QDockAreaLayoutInfo *in_RDI;
  QDockAreaLayoutItem *item;
  int itemIndex;
  QDockAreaLayoutInfo *info;
  QMainWindowLayout *mlayout;
  QMainWindowTabBar *that;
  qsizetype in_stack_ffffffffffffffb8;
  QMainWindowLayout *in_stack_fffffffffffffff8;
  QDockWidget *pQVar4;
  
  qt_mainwindow_layout((QMainWindow *)0x5f7494);
  pQVar2 = QMainWindowLayout::dockInfo(in_stack_fffffffffffffff8,(QWidget *)in_RDI);
  if (pQVar2 == (QDockAreaLayoutInfo *)0x0) {
    pQVar4 = (QDockWidget *)0x0;
  }
  else {
    iVar1 = QDockAreaLayoutInfo::tabIndexToListIndex(in_RDI,in_ESI);
    if (iVar1 < 0) {
      pQVar4 = (QDockWidget *)0x0;
    }
    else {
      pQVar3 = QList<QDockAreaLayoutItem>::at
                         ((QList<QDockAreaLayoutItem> *)&DAT_aaaaaaaaaaaaaaaa,
                          in_stack_ffffffffffffffb8);
      if (pQVar3->widgetItem == (QLayoutItem *)0x0) {
        pQVar4 = (QDockWidget *)0x0;
      }
      else {
        (*pQVar3->widgetItem->_vptr_QLayoutItem[0xd])();
        pQVar4 = qobject_cast<QDockWidget*>((QObject *)0x5f7524);
      }
    }
  }
  return pQVar4;
}

Assistant:

QDockWidget *QMainWindowTabBar::dockAt(int index) const
{
    QMainWindowTabBar *that = const_cast<QMainWindowTabBar *>(this);
    QMainWindowLayout* mlayout = qt_mainwindow_layout(mainWindow);
    QDockAreaLayoutInfo *info = mlayout->dockInfo(that);
    if (!info)
        return nullptr;

    const int itemIndex = info->tabIndexToListIndex(index);
    if (itemIndex >= 0) {
        Q_ASSERT(itemIndex < info->item_list.count());
        const QDockAreaLayoutItem &item = info->item_list.at(itemIndex);
        return item.widgetItem ? qobject_cast<QDockWidget *>(item.widgetItem->widget()) : nullptr;
    }

    return nullptr;
}